

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test::testBody
          (TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *test;
  MockSupport *pMVar2;
  SimpleString local_150;
  SimpleString local_140;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  undefined1 local_c0 [8];
  MockUnexpectedCallHappenedFailure expectedFailure;
  SimpleString local_48 [2];
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString(local_48,"lazy");
  MockExpectedCallsListForTest::addFunction((MockExpectedCallsListForTest *)local_28,0,local_48);
  SimpleString::~SimpleString(local_48);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"influence");
  pMVar1 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_28,
                      (SimpleString *)
                      &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(pMVar1,1);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_d0,"lazy");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_c0,test,&local_d0,
             (MockExpectedCallsList *)local_28);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_f0,"lazy");
  (*pMVar2->_vptr_MockSupport[4])(pMVar2,&local_f0);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString(&local_100,"");
  pMVar2 = mock(&local_100,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_110,"influence");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_110);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::SimpleString(&local_120,"");
  pMVar2 = mock(&local_120,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_130,"influence");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_130);
  SimpleString::~SimpleString(&local_130);
  SimpleString::~SimpleString(&local_120);
  SimpleString::SimpleString(&local_140,"");
  pMVar2 = mock(&local_140,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_150,"lazy");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_150);
  SimpleString::~SimpleString(&local_150);
  SimpleString::~SimpleString(&local_140);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0xe1);
  MockUnexpectedCallHappenedFailure::~MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_c0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallDoesntInfluenceExpectOneCall)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    expectations.addFunction("influence")->callWasMade(1);
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().expectOneCall("influence");
    mock().actualCall("influence");
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}